

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

int Acb_ComputeSuppCost(Vec_Int_t *vSupp,Vec_Int_t *vWeights,int iFirstDiv)

{
  int iVar1;
  undefined4 local_28;
  int Cost;
  int Entry;
  int i;
  int iFirstDiv_local;
  Vec_Int_t *vWeights_local;
  Vec_Int_t *vSupp_local;
  
  local_28 = 0;
  for (Cost = 0; iVar1 = Vec_IntSize(vSupp), Cost < iVar1; Cost = Cost + 1) {
    iVar1 = Vec_IntEntry(vSupp,Cost);
    iVar1 = Abc_Lit2Var(iVar1);
    iVar1 = Vec_IntEntry(vWeights,iVar1 - iFirstDiv);
    local_28 = iVar1 + local_28;
  }
  return local_28;
}

Assistant:

int Acb_ComputeSuppCost( Vec_Int_t * vSupp, Vec_Int_t * vWeights, int iFirstDiv )
{
    int i, Entry, Cost = 0;
    Vec_IntForEachEntry( vSupp, Entry, i )
        Cost += Vec_IntEntry( vWeights, Abc_Lit2Var(Entry) - iFirstDiv );
    return Cost;
}